

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_Dxygtdyz(DdManager *dd,int N,DdNode **x,DdNode **y,DdNode **z)

{
  DdNode *g;
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *n;
  DdNode *g_00;
  DdNode *g_01;
  DdNode *n_00;
  int local_84;
  DdNode *pDStack_80;
  int i;
  DdNode *x1;
  DdNode *y2;
  DdNode *y1_;
  DdNode *z4;
  DdNode *z3;
  DdNode *z2;
  DdNode *z1;
  DdNode *zero;
  DdNode *one;
  DdNode **z_local;
  DdNode **y_local;
  DdNode **x_local;
  int N_local;
  DdManager *dd_local;
  
  g = dd->one;
  pDVar1 = Cudd_bddIte(dd,y[N + -1],g,z[N + -1]);
  if (pDVar1 == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
    pDVar2 = Cudd_bddIte(dd,y[N + -1],z[N + -1],(DdNode *)((ulong)g ^ 1));
    if (pDVar2 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar1);
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
      pDStack_80 = Cudd_bddIte(dd,x[N + -1],pDVar1,(DdNode *)((ulong)pDVar2 ^ 1));
      if (pDStack_80 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar1);
        Cudd_RecursiveDeref(dd,pDVar2);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref(dd,pDVar1);
        Cudd_RecursiveDeref(dd,pDVar2);
        for (local_84 = N + -2; -1 < local_84; local_84 = local_84 + -1) {
          pDVar1 = Cudd_bddIte(dd,z[local_84],pDStack_80,(DdNode *)((ulong)g ^ 1));
          if (pDVar1 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDStack_80);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          pDVar2 = Cudd_bddIte(dd,z[local_84],pDStack_80,g);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDStack_80);
            Cudd_RecursiveDeref(dd,pDVar1);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          n = Cudd_bddIte(dd,z[local_84],g,pDStack_80);
          if (n == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDStack_80);
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDeref(dd,pDVar2);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + 1;
          g_00 = Cudd_bddIte(dd,z[local_84],g,(DdNode *)((ulong)pDStack_80 ^ 1));
          if (g_00 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDStack_80);
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDeref(dd,pDVar2);
            Cudd_RecursiveDeref(dd,n);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,pDStack_80);
          g_01 = Cudd_bddIte(dd,y[local_84],pDVar2,pDVar1);
          if (g_01 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDeref(dd,pDVar2);
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,g_00);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)g_01 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)g_01 & 0xfffffffffffffffe) + 4) + 1;
          n_00 = Cudd_bddIte(dd,y[local_84],g_00,(DdNode *)((ulong)n ^ 1));
          if (n_00 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDeref(dd,pDVar2);
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,g_00);
            Cudd_RecursiveDeref(dd,g_01);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,pDVar1);
          Cudd_RecursiveDeref(dd,pDVar2);
          Cudd_RecursiveDeref(dd,n);
          Cudd_RecursiveDeref(dd,g_00);
          pDStack_80 = Cudd_bddIte(dd,x[local_84],g_01,(DdNode *)((ulong)n_00 ^ 1));
          if (pDStack_80 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,g_01);
            Cudd_RecursiveDeref(dd,n_00);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,g_01);
          Cudd_RecursiveDeref(dd,n_00);
        }
        *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDStack_80 & 0xfffffffffffffffe) + 4) + -1;
        dd_local = (DdManager *)((ulong)pDStack_80 ^ 1);
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_Dxygtdyz(
  DdManager * dd /* DD manager */,
  int  N /* number of x, y, and z variables */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */,
  DdNode ** z /* array of z variables */)
{
    DdNode *one, *zero;
    DdNode *z1, *z2, *z3, *z4, *y1_, *y2, *x1;
    int     i;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    /* Build bottom part of BDD outside loop. */
    y1_ = Cudd_bddIte(dd, y[N-1], one, z[N-1]);
    if (y1_ == NULL) return(NULL);
    cuddRef(y1_);
    y2 = Cudd_bddIte(dd, y[N-1], z[N-1], zero);
    if (y2 == NULL) {
        Cudd_RecursiveDeref(dd, y1_);
        return(NULL);
    }
    cuddRef(y2);
    x1 = Cudd_bddIte(dd, x[N-1], y1_, Cudd_Not(y2));
    if (x1 == NULL) {
        Cudd_RecursiveDeref(dd, y1_);
        Cudd_RecursiveDeref(dd, y2);
        return(NULL);
    }
    cuddRef(x1);
    Cudd_RecursiveDeref(dd, y1_);
    Cudd_RecursiveDeref(dd, y2);

    /* Loop to build the rest of the BDD. */
    for (i = N-2; i >= 0; i--) {
        z1 = Cudd_bddIte(dd, z[i], x1, zero);
        if (z1 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            return(NULL);
        }
        cuddRef(z1);
        z2 = Cudd_bddIte(dd, z[i], x1, one);
        if (z2 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            return(NULL);
        }
        cuddRef(z2);
        z3 = Cudd_bddIte(dd, z[i], one, x1);
        if (z3 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            return(NULL);
        }
        cuddRef(z3);
        z4 = Cudd_bddIte(dd, z[i], one, Cudd_Not(x1));
        if (z4 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            return(NULL);
        }
        cuddRef(z4);
        Cudd_RecursiveDeref(dd, x1);
        y1_ = Cudd_bddIte(dd, y[i], z2, z1);
        if (y1_ == NULL) {
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            Cudd_RecursiveDeref(dd, z4);
            return(NULL);
        }
        cuddRef(y1_);
        y2 = Cudd_bddIte(dd, y[i], z4, Cudd_Not(z3));
        if (y2 == NULL) {
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            Cudd_RecursiveDeref(dd, z4);
            Cudd_RecursiveDeref(dd, y1_);
            return(NULL);
        }
        cuddRef(y2);
        Cudd_RecursiveDeref(dd, z1);
        Cudd_RecursiveDeref(dd, z2);
        Cudd_RecursiveDeref(dd, z3);
        Cudd_RecursiveDeref(dd, z4);
        x1 = Cudd_bddIte(dd, x[i], y1_, Cudd_Not(y2));
        if (x1 == NULL) {
            Cudd_RecursiveDeref(dd, y1_);
            Cudd_RecursiveDeref(dd, y2);
            return(NULL);
        }
        cuddRef(x1);
        Cudd_RecursiveDeref(dd, y1_);
        Cudd_RecursiveDeref(dd, y2);
    }
    cuddDeref(x1);
    return(Cudd_Not(x1));

}